

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall slang::ast::TypePrinter::TypePrinter(TypePrinter *this)

{
  (this->options).anonymousTypeStyle = SystemName;
  (this->options).addSingleQuotes = false;
  (this->options).elideScopeNames = false;
  (this->options).printAKA = false;
  (this->options).skipScopedTypeNames = false;
  (this->options).skipTypeDefs = false;
  (this->options).fullEnumType = false;
  std::make_unique<slang::FormatBuffer>();
  return;
}

Assistant:

TypePrinter::TypePrinter() : buffer(std::make_unique<FormatBuffer>()) {
}